

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O0

void absl::ascii_internal::AsciiStrCaseFoldImpl<true,true>(char *dst,char *src,size_t size)

{
  byte c;
  bool bVar1;
  byte bVar2;
  ulong uStack_30;
  uchar v;
  size_t i;
  uchar kAsciiCaseBitFlip;
  size_t size_local;
  char *src_local;
  char *dst_local;
  
  for (uStack_30 = 0; uStack_30 < size; uStack_30 = uStack_30 + 1) {
    c = src[uStack_30];
    bVar1 = AsciiInAZRangeNaive<true>(c);
    bVar2 = 0;
    if (bVar1) {
      bVar2 = 0x20;
    }
    dst[uStack_30] = c ^ bVar2;
  }
  return;
}

Assistant:

constexpr void AsciiStrCaseFoldImpl(char* absl_nonnull dst,
                                    const char* absl_nullable src,
                                    size_t size) {
  // The upper- and lowercase versions of ASCII characters differ by only 1 bit.
  // When we need to flip the case, we can xor with this bit to achieve the
  // desired result. Note that the choice of 'a' and 'A' here is arbitrary. We
  // could have chosen 'z' and 'Z', or any other pair of characters as they all
  // have the same single bit difference.
  constexpr unsigned char kAsciiCaseBitFlip = 'a' ^ 'A';

  for (size_t i = 0; i < size; ++i) {
    unsigned char v = static_cast<unsigned char>(src[i]);
    if ABSL_INTERNAL_CONSTEXPR_SINCE_CXX17 (Naive) {
      v ^= AsciiInAZRangeNaive<ToUpper>(v) ? kAsciiCaseBitFlip : 0;
    } else {
      v ^= AsciiInAZRange<ToUpper>(v) ? kAsciiCaseBitFlip : 0;
    }
    dst[i] = static_cast<char>(v);
  }